

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::Extents(ON_Viewport *this,double angle,ON_BoundingBox *bbox)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  ON_3dVector local_100;
  ON_3dPoint local_e8;
  undefined1 local_d0 [8];
  ON_3dVector box_corner;
  ON_3dPoint center;
  ON_3dVector camY;
  ON_3dVector camX;
  int local_68;
  int k;
  int j;
  int i;
  double ymax;
  double ymin;
  double xmax;
  double xmin;
  double y;
  double x;
  double radius;
  ON_BoundingBox *bbox_local;
  double angle_local;
  ON_Viewport *this_local;
  
  bVar4 = ON_BoundingBox::IsValid(bbox);
  if ((bVar4) &&
     (uVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0),
     (uVar5 & 1) != 0)) {
    CameraX((ON_3dVector *)&camY.z,this);
    CameraY((ON_3dVector *)&center.z,this);
    ON_BoundingBox::Center((ON_3dPoint *)&box_corner.z,bbox);
    _j = 0.0;
    ymax = 0.0;
    ymin = 0.0;
    xmax = 0.0;
    for (k = 0; k < 2; k = k + 1) {
      for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
        for (camX.z._4_4_ = 0; camX.z._4_4_ < 2; camX.z._4_4_ = camX.z._4_4_ + 1) {
          ON_BoundingBox::Corner(&local_e8,bbox,k,local_68,camX.z._4_4_);
          ON_3dVector::ON_3dVector((ON_3dVector *)local_d0,&local_e8);
          dVar6 = ON_3dVector::operator*((ON_3dVector *)&camY.z,(ON_3dVector *)local_d0);
          dVar7 = ON_3dVector::operator*((ON_3dVector *)&center.z,(ON_3dVector *)local_d0);
          dVar1 = dVar7;
          if (((k != 0) || (local_68 != 0)) || (dVar2 = dVar7, dVar3 = dVar6, camX.z._4_4_ != 0)) {
            dVar2 = dVar6;
            if ((dVar6 <= ymin) && (dVar2 = ymin, dVar6 < xmax)) {
              xmax = dVar6;
            }
            ymin = dVar2;
            dVar2 = ymax;
            dVar6 = ymin;
            dVar3 = xmax;
            if ((dVar7 <= _j) && (dVar1 = _j, dVar7 < ymax)) {
              dVar2 = dVar7;
            }
          }
          xmax = dVar3;
          ymin = dVar6;
          ymax = dVar2;
          _j = dVar1;
        }
      }
    }
    x = ymin - xmax;
    if (x < _j - ymax) {
      x = _j - ymax;
    }
    if (x <= 1.490116119385e-08) {
      ON_BoundingBox::Diagonal(&local_100,bbox);
      x = ON_3dVector::MaximumCoordinate(&local_100);
    }
    x = x * 0.5;
    if (x <= 1.490116119385e-08) {
      x = 1.0;
    }
    this_local._7_1_ = Extents(this,angle,(ON_3dPoint *)&box_corner.z,x);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Viewport::Extents( double angle, const ON_BoundingBox& bbox )
{
  double radius;
  double x, y, xmin, xmax, ymin, ymax;
  int i,j,k;

  if ( !bbox.IsValid() || !IsValid() )
    return false;
  ON_3dVector camX = CameraX();
  ON_3dVector camY = CameraY();
  ON_3dPoint center = bbox.Center();
  xmin=xmax=ymin=ymax=0.0;
  for (i=0;i<2;i++) for (j=0;j<2;j++) for (k=0;k<2;k++) {
    ON_3dVector box_corner = bbox.Corner(i,j,k);
    x = camX*box_corner;
    y = camY*box_corner;
    if ( i==0&&j==0&&k==0) {
      xmin=xmax=x;
      ymin=ymax=y;
    }
    else {
      if ( x > xmax) xmax=x; else if (x < xmin) xmin = x;
      if ( y > ymax) ymax=y; else if (y < ymin) ymin = y;
    }
  }
  radius = xmax-xmin;
  if ( ymax-ymin > radius )
    radius = ymax-ymin;
  if ( radius <= ON_SQRT_EPSILON ) {
    radius = bbox.Diagonal().MaximumCoordinate();
  }
  radius *= 0.5;
  if ( radius <= ON_SQRT_EPSILON )
    radius = 1.0;
  return Extents( angle, center, radius );
}